

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iCol2;
  int iCol1;
  byte *local_88;
  byte *local_80;
  sqlite3_int64 iPos2;
  sqlite3_int64 iPos1;
  char *local_68;
  int local_5c;
  sqlite3_int64 iPrev;
  char **local_50;
  char **local_48;
  char **local_40;
  long local_38;
  
  local_68 = *pp;
  local_88 = (byte *)*pp1;
  pbVar9 = (byte *)*pp2;
  iCol1 = 0;
  iCol2 = 0;
  local_80 = pbVar9;
  local_5c = isExact;
  local_50 = pp1;
  local_48 = pp2;
  local_40 = pp;
  if (*local_88 == 1) {
    pbVar10 = local_88 + 1;
    if ((char)local_88[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)pbVar10,&iCol1);
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar4 = 1;
      iCol1 = (int)(char)local_88[1];
    }
    local_88 = pbVar10 + uVar4;
  }
  if (*pbVar9 == 1) {
    if ((char)pbVar9[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pbVar9 + 1),&iCol2);
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar4 = 1;
      iCol2 = (int)(char)pbVar9[1];
    }
    local_80 = pbVar9 + 1 + uVar4;
  }
  local_38 = (long)nToken;
  do {
    while (pcVar8 = local_68, iCol1 != iCol2) {
      if (iCol2 <= iCol1) {
        fts3ColumnlistCopy((char **)0x0,(char **)&local_80);
        pbVar9 = local_80;
        if (*local_80 != 0) goto LAB_0016f689;
        goto LAB_0016f6d6;
      }
      fts3ColumnlistCopy((char **)0x0,(char **)&local_88);
      if (*local_88 == 0) goto LAB_0016f6d6;
      pbVar9 = local_88 + 1;
      if ((char)local_88[1] < '\0') {
        uVar3 = sqlite3Fts3GetVarint32((char *)pbVar9,&iCol1);
        uVar4 = (ulong)uVar3;
      }
      else {
        uVar4 = 1;
        iCol1 = (int)(char)local_88[1];
      }
      local_88 = pbVar9 + uVar4;
    }
    iPrev = 0;
    iPos1 = 0;
    iPos2 = 0;
    if (iCol1 != 0) {
      *local_68 = '\x01';
      iVar2 = sqlite3Fts3PutVarint(local_68 + 1,(long)iCol1);
      local_68 = pcVar8 + (long)iVar2 + 1;
    }
    fts3GetDeltaVarint((char **)&local_88,&iPos1);
    lVar7 = iPos1 + -2;
    iPos1 = lVar7;
    fts3GetDeltaVarint((char **)&local_80,&iPos2);
    lVar6 = iPos2 + -2;
    iPos2 = lVar6;
    while( true ) {
      lVar1 = local_38 + lVar7;
      while( true ) {
        if ((lVar6 == lVar1) || (((local_5c == 0 && (lVar7 < lVar6)) && (lVar6 <= lVar1)))) {
          lVar5 = lVar7;
          if (isSaveLeft == 0) {
            lVar5 = lVar6;
          }
          fts3PutDeltaVarint(&local_68,&iPrev,lVar5 + 2);
          iPrev = iPrev + -2;
          pcVar8 = (char *)0x0;
        }
        if ((lVar7 < lVar6) && (isSaveLeft != 0 || lVar1 < lVar6)) break;
        if (*local_80 < 2) goto LAB_0016f609;
        fts3GetDeltaVarint((char **)&local_80,&iPos2);
        lVar6 = iPos2 + -2;
        iPos2 = lVar6;
      }
      if (*local_88 < 2) break;
      fts3GetDeltaVarint((char **)&local_88,&iPos1);
      lVar7 = iPos1 + -2;
      iPos1 = lVar7;
    }
LAB_0016f609:
    if (pcVar8 != (char *)0x0) {
      local_68 = pcVar8;
    }
    fts3ColumnlistCopy((char **)0x0,(char **)&local_88);
    fts3ColumnlistCopy((char **)0x0,(char **)&local_80);
    pbVar9 = local_80;
    if ((*local_88 == 0) || (*local_80 == 0)) {
LAB_0016f6d6:
      fts3PoslistCopy((char **)0x0,(char **)&local_80);
      fts3PoslistCopy((char **)0x0,(char **)&local_88);
      *local_50 = (char *)local_88;
      *local_48 = (char *)local_80;
      pcVar8 = *local_40;
      if (pcVar8 != local_68) {
        *local_68 = '\0';
        *local_40 = local_68 + 1;
      }
      return (uint)(pcVar8 != local_68);
    }
    pbVar10 = local_88 + 1;
    if ((char)local_88[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)pbVar10,&iCol1);
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar4 = 1;
      iCol1 = (int)(char)local_88[1];
    }
    local_88 = pbVar10 + uVar4;
LAB_0016f689:
    if ((char)pbVar9[1] < '\0') {
      uVar3 = sqlite3Fts3GetVarint32((char *)(pbVar9 + 1),&iCol2);
      uVar4 = (ulong)uVar3;
    }
    else {
      uVar4 = 1;
      iCol2 = (int)(char)pbVar9[1];
    }
    local_80 = pbVar9 + 1 + uVar4;
  } while( true );
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      assert( *p1!=POS_END && *p1!=POS_COLUMN );
      assert( *p2!=POS_END && *p2!=POS_COLUMN );
      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}